

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_args(LexState *ls,ExpDesc *e)

{
  long lVar1;
  uint ins_00;
  BCPos BVar2;
  BCPos *in_RSI;
  long *in_RDI;
  BCLine line;
  BCReg base;
  BCIns ins;
  ExpDesc args;
  FuncState *fs;
  ExpDesc *in_stack_00000078;
  LexState *in_stack_00000080;
  ExpDesc *in_stack_ffffffffffffff98;
  ErrMsg em;
  BCPos *pBVar3;
  undefined4 in_stack_ffffffffffffffa0;
  int line_00;
  LexToken in_stack_ffffffffffffffa8;
  BCPos BVar4;
  LexToken in_stack_ffffffffffffffac;
  FuncState *in_stack_ffffffffffffffb0;
  int local_48;
  
  lVar1 = *in_RDI;
  line_00 = (int)in_RDI[0xc];
  em = (ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (*(int *)((long)in_RDI + 0x34) == 0x28) {
    if (line_00 != *(int *)((long)in_RDI + 100)) {
      err_syntax((LexState *)CONCAT44(line_00,in_stack_ffffffffffffffa0),em);
    }
    lj_lex_next((LexState *)0x14d74d);
    if (*(int *)((long)in_RDI + 0x34) == 0x29) {
      local_48 = 0xe;
    }
    else {
      expr_list((LexState *)CONCAT44(line_00,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      if (local_48 == 0xd) {
        *(undefined1 *)
         (*(long *)(lVar1 + 0x48) + 3 + ((ulong)in_stack_ffffffffffffffb0 & 0xffffffff) * 8) = 0;
      }
    }
    lex_match((LexState *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
              in_stack_ffffffffffffffa8,line_00);
  }
  else if (*(int *)((long)in_RDI + 0x34) == 0x7b) {
    expr_table(in_stack_00000080,in_stack_00000078);
  }
  else {
    if (*(int *)((long)in_RDI + 0x34) != 0x120) {
      err_syntax((LexState *)CONCAT44(line_00,in_stack_ffffffffffffffa0),em);
    }
    local_48 = 3;
    in_stack_ffffffffffffffb0 = (FuncState *)(ulong)*(uint *)(in_RDI + 2);
    lj_lex_next((LexState *)0x14d836);
  }
  BVar4 = *in_RSI;
  if (local_48 == 0xd) {
    ins_00 = BVar4 << 8 | 0x2000041 |
             (((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20) - BVar4) + -1) * 0x10000;
  }
  else {
    if (local_48 != 0xe) {
      expr_tonextreg((FuncState *)CONCAT44(line_00,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
    }
    ins_00 = BVar4 << 8 | 0x2000042 | (*(int *)(lVar1 + 0x34) - BVar4) * 0x10000;
  }
  pBVar3 = in_RSI;
  BVar2 = bcemit_INS(in_stack_ffffffffffffffb0,ins_00);
  pBVar3[2] = 0xd;
  *pBVar3 = BVar2;
  pBVar3[3] = 0xffffffff;
  pBVar3[4] = 0xffffffff;
  in_RSI[1] = BVar4;
  *(int *)(*(long *)(lVar1 + 0x48) + 4 + (ulong)(*(int *)(lVar1 + 0x28) - 1) * 8) = line_00;
  *(BCPos *)(lVar1 + 0x34) = BVar4 + 1;
  return;
}

Assistant:

static void parse_args(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  ExpDesc args;
  BCIns ins;
  BCReg base;
  BCLine line = ls->linenumber;
  if (ls->tok == '(') {
#if !LJ_52
    if (line != ls->lastline)
      err_syntax(ls, LJ_ERR_XAMBIG);
#endif
    lj_lex_next(ls);
    if (ls->tok == ')') {  /* f(). */
      args.k = VVOID;
    } else {
      expr_list(ls, &args);
      if (args.k == VCALL)  /* f(a, b, g()) or f(a, b, ...). */
	setbc_b(bcptr(fs, &args), 0);  /* Pass on multiple results. */
    }
    lex_match(ls, ')', '(', line);
  } else if (ls->tok == '{') {
    expr_table(ls, &args);
  } else if (ls->tok == TK_string) {
    expr_init(&args, VKSTR, 0);
    args.u.sval = strV(&ls->tokval);
    lj_lex_next(ls);
  } else {
    err_syntax(ls, LJ_ERR_XFUNARG);
    return;  /* Silence compiler. */
  }
  lj_assertFS(e->k == VNONRELOC, "bad expr type %d", e->k);
  base = e->u.s.info;  /* Base register for call. */
  if (args.k == VCALL) {
    ins = BCINS_ABC(BC_CALLM, base, 2, args.u.s.aux - base - 1 - LJ_FR2);
  } else {
    if (args.k != VVOID)
      expr_tonextreg(fs, &args);
    ins = BCINS_ABC(BC_CALL, base, 2, fs->freereg - base - LJ_FR2);
  }
  expr_init(e, VCALL, bcemit_INS(fs, ins));
  e->u.s.aux = base;
  fs->bcbase[fs->pc - 1].line = line;
  fs->freereg = base+1;  /* Leave one result by default. */
}